

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

void PPrintXmlDecl(TidyDocImpl *doc,uint indent,Node *node)

{
  TidyPrintImpl *pprint;
  uint uVar1;
  uint saveWrap;
  AttVal *pAVar2;
  
  pprint = &doc->pprint;
  SetWrap(doc,indent);
  saveWrap = WrapOff(doc);
  uVar1 = *(uint *)((doc->config).value + 0x54);
  prvTidySetOptionInt(doc,TidyUpperCaseAttrs,0);
  AddString(pprint,"<?xml");
  pAVar2 = prvTidyAttrGetById(node,TidyAttr_VERSION);
  if (pAVar2 != (AttVal *)0x0) {
    PPrintAttribute(doc,indent,node,pAVar2);
  }
  pAVar2 = prvTidyAttrGetById(node,TidyAttr_ENCODING);
  if (pAVar2 != (AttVal *)0x0) {
    PPrintAttribute(doc,indent,node,pAVar2);
  }
  pAVar2 = prvTidyGetAttrByName(node,"standalone");
  if (pAVar2 != (AttVal *)0x0) {
    PPrintAttribute(doc,indent,node,pAVar2);
  }
  prvTidySetOptionInt(doc,TidyUpperCaseAttrs,(ulong)uVar1);
  if ((node->end == 0) || (doc->lexer->lexbuf[node->end - 1] != '?')) {
    AddChar(pprint,0x3f);
  }
  AddChar(pprint,0x3e);
  WrapOn(doc,saveWrap);
  PFlushLineSmart(doc,indent);
  return;
}

Assistant:

static void PPrintXmlDecl( TidyDocImpl* doc, uint indent, Node *node )
{
    AttVal* att;
    uint saveWrap;
    TidyPrintImpl* pprint = &doc->pprint;
    Bool ucAttrs;
    SetWrap( doc, indent );
    saveWrap = WrapOff( doc );

    /* no case translation for XML declaration pseudo attributes */
    ucAttrs = cfg(doc, TidyUpperCaseAttrs);
    TY_(SetOptionInt)(doc, TidyUpperCaseAttrs, no);

    AddString( pprint, "<?xml" );

    /* Force order of XML declaration attributes */
    /* PPrintAttrs( doc, indent, node ); */
    if ( NULL != (att = TY_(AttrGetById)(node, TidyAttr_VERSION)) )
      PPrintAttribute( doc, indent, node, att );
    if ( NULL != (att = TY_(AttrGetById)(node, TidyAttr_ENCODING)) )
      PPrintAttribute( doc, indent, node, att );
    if ( NULL != (att = TY_(GetAttrByName)(node, "standalone")) )
      PPrintAttribute( doc, indent, node, att );

    /* restore old config value */
    TY_(SetOptionInt)(doc, TidyUpperCaseAttrs, ucAttrs);

    if ( node->end <= 0 || doc->lexer->lexbuf[node->end - 1] != '?' )
        AddChar( pprint, '?' );
    AddChar( pprint, '>' );
    WrapOn( doc, saveWrap );
    PFlushLineSmart( doc, indent );
}